

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
spdlog::details::make_unique<spdlog::pattern_formatter>(void)

{
  tuple<spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_> in_RDI;
  string *in_stack_00000020;
  pattern_time_type in_stack_0000002c;
  pattern_formatter *in_stack_00000030;
  pointer in_stack_ffffffffffffff98;
  _Head_base<0UL,_spdlog::pattern_formatter_*,_false> this;
  allocator local_29;
  string local_28 [40];
  
  this._M_head_impl =
       (pattern_formatter *)
       in_RDI.
       super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
       .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl;
  operator_new(0xe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"\n",&local_29);
  pattern_formatter::pattern_formatter(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  std::unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>>::
  unique_ptr<std::default_delete<spdlog::pattern_formatter>,void>
            ((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)this._M_head_impl,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return (__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
             .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&... args)
{
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}